

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverSetCubeSizes(Mvc_Cover_t *pCover)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  int local_38;
  int nOnes;
  int nBytes;
  uchar *pByteStop;
  uchar *pByteStart;
  uchar *pByte;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = pCover->nBits;
  uVar2 = pCover->nBits;
  for (pByte = (uchar *)(pCover->lCubes).pHead; pByte != (uchar *)0x0; pByte = *(uchar **)pByte) {
    local_38 = 0;
    pByteStart = pByte + 0x10;
    puVar3 = pByteStart + (int)((int)((ulong)(long)iVar1 >> 3) + (uint)((uVar2 & 7) != 0));
    for (; pByteStart < puVar3; pByteStart = pByteStart + 1) {
      local_38 = bit_count[*pByteStart] + local_38;
    }
    *(int *)(pByte + 0xc) = local_38;
  }
  return 1;
}

Assistant:

int Mvc_CoverSetCubeSizes( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;

    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
    {
        // clean the counter of ones
        nOnes = 0;
        // set the starting and stopping positions
        pByteStart = (unsigned char *)pCube->pData;
        pByteStop  = pByteStart + nBytes;
        // iterate through the positions
        for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
            nOnes += bit_count[*pByte];
        // set the nOnes
        Mvc_CubeSetSize( pCube, nOnes );
    }
    return 1;
}